

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

BinaryExpr<const_protozero::const_fixed_iterator<double>_&,_const_protozero::const_fixed_iterator<double>_&>
* __thiscall
Catch::ExprLhs<protozero::const_fixed_iterator<double>const&>::operator==
          (BinaryExpr<const_protozero::const_fixed_iterator<double>_&,_const_protozero::const_fixed_iterator<double>_&>
           *__return_storage_ptr__,ExprLhs<protozero::const_fixed_iterator<double>const&> *this,
          const_fixed_iterator<double> *rhs)

{
  const_fixed_iterator<double> *pcVar1;
  char *pcVar2;
  char *pcVar3;
  StringRef local_40;
  
  pcVar1 = *(const_fixed_iterator<double> **)this;
  pcVar2 = pcVar1->m_data;
  pcVar3 = rhs->m_data;
  StringRef::StringRef(&local_40,"==");
  (__return_storage_ptr__->super_ITransientExpression).m_isBinaryExpression = true;
  (__return_storage_ptr__->super_ITransientExpression).m_result = pcVar2 == pcVar3;
  (__return_storage_ptr__->super_ITransientExpression)._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_0022d890;
  __return_storage_ptr__->m_lhs = pcVar1;
  (__return_storage_ptr__->m_op).m_start = local_40.m_start;
  (__return_storage_ptr__->m_op).m_size = local_40.m_size;
  __return_storage_ptr__->m_rhs = rhs;
  return __return_storage_ptr__;
}

Assistant:

auto operator == ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareEqual( m_lhs, rhs ), m_lhs, "==", rhs };
        }